

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_int,long_long,16>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint *lhs,longlong *rhs,longlong *result)

{
  uint uVar1;
  long lVar2;
  code *pcVar3;
  ulong uVar4;
  ulong *in_RDX;
  long *in_RSI;
  uint *in_RDI;
  uint64_t tmp;
  
  if (*in_RSI < 0) {
    uVar1 = *in_RDI;
    lVar2 = *in_RSI;
    uVar4 = std::numeric_limits<long_long>::max();
    if (uVar4 < (ulong)uVar1 - lVar2) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = (ulong)uVar1 - lVar2;
  }
  else {
    if (SBORROW8((ulong)*in_RDI,*in_RSI)) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *in_RDX = (ulong)*in_RDI - *in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // U unsigned 32-bit or less, T std::int64_t
        if( rhs >= 0 )
        {
            // overflow not possible
            result = (T)( (std::int64_t)lhs - rhs );
            return;
        }
        else
        {
            // we effectively have an addition
            // which cannot overflow internally
            std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)( -rhs );

            if( tmp <= (std::uint64_t)std::numeric_limits<T>::max() )
            {
                result = (T)tmp;
                return;
            }
        }

        E::SafeIntOnOverflow();
    }